

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::_InternalSerialize
          (FeatureSetDefaults_FeatureSetEditionDefault *this,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  uint uVar1;
  FeatureSet *pFVar2;
  bool bVar3;
  Edition value;
  int iVar4;
  uint32_t *puVar5;
  uint8_t *target_00;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  FeatureSetDefaults_FeatureSetEditionDefault *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  FeatureSetDefaults_FeatureSetEditionDefault *this_local;
  
  puVar5 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar5;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 4) != 0) {
    target_00 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = _internal_edition(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(3,value,target_00);
  }
  if ((uVar1 & 1) != 0) {
    pFVar2 = (this->field_0)._impl_.overridable_features_;
    iVar4 = FeatureSet::GetCachedSize((this->field_0)._impl_.overridable_features_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (4,(MessageLite *)pFVar2,iVar4,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 2) != 0) {
    pFVar2 = (this->field_0)._impl_.fixed_features_;
    iVar4 = FeatureSet::GetCachedSize((this->field_0)._impl_.fixed_features_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (5,(MessageLite *)pFVar2,iVar4,(uint8_t *)stream_local,stream);
  }
  bVar3 = internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar3) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FeatureSetDefaults_FeatureSetEditionDefault::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FeatureSetDefaults_FeatureSetEditionDefault& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FeatureSetDefaults.FeatureSetEditionDefault)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional .google.protobuf.Edition edition = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        3, this_._internal_edition(), target);
  }

  // optional .google.protobuf.FeatureSet overridable_features = 4;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.overridable_features_, this_._impl_.overridable_features_->GetCachedSize(), target,
        stream);
  }

  // optional .google.protobuf.FeatureSet fixed_features = 5;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        5, *this_._impl_.fixed_features_, this_._impl_.fixed_features_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FeatureSetDefaults.FeatureSetEditionDefault)
  return target;
}